

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.h
# Opt level: O1

void __thiscall senjo::PerftCommandHandle::~PerftCommandHandle(PerftCommandHandle *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BackgroundCommand)._vptr_BackgroundCommand =
       (_func_int **)&PTR__PerftCommandHandle_00152ca8;
  pcVar2 = (this->fileName)._M_dataplus._M_p;
  paVar1 = &(this->fileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

PerftCommandHandle(ChessEngine* engine) : BackgroundCommand(engine) { }